

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RendererTests.cpp
# Opt level: O3

void __thiscall
agge::tests::RendererTests::CoverIsAccumulatedFromCellsAtTheSamePosition(RendererTests *this)

{
  long lVar1;
  pointer psVar2;
  int iVar3;
  long lVar4;
  int x;
  int cover;
  uint uVar5;
  scanline_mockup sl;
  string local_a0;
  LocationInfo local_80;
  scanline_mockup local_58;
  
  local_58.excepted_y = -1000000;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.spans_log.
  super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58._inprogress = true;
  local_58._current_y = 0x7fffffff;
  lVar4 = 0;
  uVar5 = 0;
  do {
    x = *(int *)((long)&DAT_001a14b0 + lVar4);
    iVar3 = 0;
    do {
      lVar1 = lVar4;
      lVar4 = lVar1 + 0xc;
      iVar3 = iVar3 + *(int *)((long)&DAT_001a14b4 + lVar1);
      uVar5 = uVar5 + *(int *)((long)&DAT_001a14b8 + lVar1);
      if (lVar4 == 0x54) break;
    } while (*(int *)((long)&DAT_001a14bc + lVar1) == x);
    if (iVar3 != 0) {
      anon_unknown_1::scanline_mockup::add_cell(&local_58,x,uVar5 * 0x200 - iVar3);
      x = x + 1;
    }
    if (lVar4 == 0x54) {
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/RendererTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_80,&local_a0,0xae);
      psVar2 = local_58.spans_log.
               super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ut::
      are_equal<agge::tests::(anonymous_namespace)::span,3ul,std::vector<agge::tests::(anonymous_namespace)::span,std::allocator<agge::tests::(anonymous_namespace)::span>>>
                ((ut *)&DAT_001a1510,
                 (span (*) [3])
                 local_58.spans_log.
                 super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (vector<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                  *)local_58.spans_log.
                    super__Vector_base<agge::tests::(anonymous_namespace)::span,_std::allocator<agge::tests::(anonymous_namespace)::span>_>
                    ._M_impl.super__Vector_impl_data._M_finish,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.filename._M_dataplus._M_p != &local_80.filename.field_2) {
        operator_delete(local_80.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      if (psVar2 != (pointer)0x0) {
        operator_delete(psVar2);
      }
      return;
    }
    iVar3 = *(int *)((long)&DAT_001a14bc + lVar1) - x;
    if ((iVar3 != 0) && ((uVar5 & 0x7fffff) != 0)) {
      anon_unknown_1::scanline_mockup::add_span(&local_58,x,iVar3,uVar5 * 0x200);
    }
  } while( true );
}

Assistant:

test( CoverIsAccumulatedFromCellsAtTheSamePosition )
			{
				// INIT
				scanline_mockup sl;
				mocks::cell cells[] = {
					{ 7, 0, 10 }, { 7, 0, 3 }, { 10, 0, -10 }, { 10, 0, -3 },
					{ 1911, 0, 17 }, { 1931, 0, -13 }, { 1940, 0, -4 },
				};

				// ACT
				sweep_scanline<8>(sl, begin(cells), end(cells), bypass_alpha());

				// ASSERT
				span reference[] = {
					{ 0x7fffffff, 7, 3, 13 * 512 },
					{ 0x7fffffff, 1911, 20, 17 * 512 },
					{ 0x7fffffff, 1931, 9, 4 * 512 },
				};

				assert_equal(reference, sl.spans_log);
			}